

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

void __thiscall Fl_Window::resize(Fl_Window *this,int X,int Y,int W,int H)

{
  uint *puVar1;
  Window WVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  Fl_Window *pFVar9;
  
  pFVar9 = resize_bug_fix;
  bVar3 = (this->super_Fl_Group).super_Fl_Widget.y_ == Y;
  bVar4 = (this->super_Fl_Group).super_Fl_Widget.x_ == X;
  bVar5 = (this->super_Fl_Group).super_Fl_Widget.h_ == H;
  bVar6 = (this->super_Fl_Group).super_Fl_Widget.w_ == W;
  if (resize_bug_fix == this) {
    resize_bug_fix = (Fl_Window *)0x0;
  }
  else if (!bVar3 || !bVar4) {
    puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
    *(byte *)puVar1 = (byte)*puVar1 | 0x10;
    goto LAB_00191964;
  }
  if ((bVar3 && bVar4) && (bVar5 && bVar6)) {
    return;
  }
LAB_00191964:
  if (bVar5 && bVar6) {
    (this->super_Fl_Group).super_Fl_Widget.x_ = X;
    (this->super_Fl_Group).super_Fl_Widget.y_ = Y;
  }
  else {
    Fl_Group::resize(&this->super_Fl_Group,X,Y,W,H);
    if (this->i != (Fl_X *)0x0) {
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    if ((pFVar9 != this) && ((this->super_Fl_Group).resizable_ == (Fl_Widget *)0x0)) {
      iVar7 = (this->super_Fl_Group).super_Fl_Widget.w_;
      iVar8 = (this->super_Fl_Group).super_Fl_Widget.h_;
      this->minw = iVar7;
      this->minh = iVar8;
      this->maxw = iVar7;
      this->maxh = iVar8;
      this->dw = 0;
      this->dh = 0;
      this->aspect = 0;
      size_range_(this);
    }
  }
  if ((pFVar9 == this) || (this->i == (Fl_X *)0x0)) {
    return;
  }
  if (bVar5 && bVar6) {
    XMoveWindow(fl_display,this->i->xid,X,Y);
    return;
  }
  if ((this->super_Fl_Group).resizable_ == (Fl_Widget *)0x0) {
    iVar7 = (this->super_Fl_Group).super_Fl_Widget.w_;
    iVar8 = (this->super_Fl_Group).super_Fl_Widget.h_;
    this->minw = iVar7;
    this->minh = iVar8;
    this->maxw = iVar7;
    this->maxh = iVar8;
    this->dw = 0;
    this->dh = 0;
    this->aspect = 0;
    size_range_(this);
  }
  WVar2 = this->i->xid;
  if (W < 2) {
    W = 1;
  }
  iVar7 = 1;
  if (1 < H) {
    iVar7 = H;
  }
  if (bVar3 && bVar4) {
    XResizeWindow(fl_display,WVar2,W,iVar7);
    return;
  }
  XMoveResizeWindow(fl_display,WVar2,X,Y,W);
  return;
}

Assistant:

void Fl_Window::resize(int X,int Y,int W,int H) {
  int is_a_move = (X != x() || Y != y());
  int is_a_resize = (W != w() || H != h());
  int resize_from_program = (this != resize_bug_fix);
  if (!resize_from_program) resize_bug_fix = 0;
  if (is_a_move && resize_from_program) set_flag(FORCE_POSITION);
  else if (!is_a_resize && !is_a_move) return;
  if (is_a_resize) {
    Fl_Group::resize(X,Y,W,H);
    if (shown()) {redraw();}
  } else {
    x(X); y(Y);
  }

  if (resize_from_program && is_a_resize && !resizable()) {
    size_range(w(), h(), w(), h());
  }

  if (resize_from_program && shown()) {
    if (is_a_resize) {
      if (!resizable()) size_range(w(),h(),w(),h());
      if (is_a_move) {
        XMoveResizeWindow(fl_display, i->xid, X, Y, W>0 ? W : 1, H>0 ? H : 1);
      } else {
        XResizeWindow(fl_display, i->xid, W>0 ? W : 1, H>0 ? H : 1);
      }
    } else
      XMoveWindow(fl_display, i->xid, X, Y);
  }
}